

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuResultCollector.cpp
# Opt level: O1

void __thiscall
tcu::ResultCollector::setTestContextResult(ResultCollector *this,TestContext *testCtx)

{
  pointer pcVar1;
  qpTestResult testResult;
  long *local_40 [2];
  long local_30 [2];
  
  testResult = QP_TEST_RESULT_PASS;
  if (this->m_result != QP_TEST_RESULT_LAST) {
    testResult = this->m_result;
  }
  pcVar1 = (this->m_message)._M_dataplus._M_p;
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_40,pcVar1,pcVar1 + (this->m_message)._M_string_length);
  TestContext::setTestResult(testCtx,testResult,(char *)local_40[0]);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return;
}

Assistant:

void ResultCollector::setTestContextResult (TestContext& testCtx)
{
	testCtx.setTestResult(getResult(), getMessage().c_str());
}